

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsort.cpp
# Opt level: O3

void __thiscall CVmQSortData::sort(CVmQSortData *this,size_t l,size_t r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  uint local_54;
  
  if (l < r) {
    iVar1 = (int)r;
    do {
      iVar2 = (int)l;
      iVar10 = iVar2 + -1;
      uVar5 = r & 0xffffffff;
      sVar4 = r;
      do {
        lVar8 = (long)iVar10;
        uVar11 = -iVar10;
        do {
          lVar8 = lVar8 + 1;
          iVar10 = iVar1;
          local_54 = iVar1 - 1;
          if (iVar1 == lVar8) goto LAB_0027e5a4;
          iVar10 = (**this->_vptr_CVmQSortData)(this,lVar8,sVar4);
          uVar11 = uVar11 - 1;
        } while (iVar10 < 0);
        iVar10 = -uVar11;
        local_54 = ~uVar11;
LAB_0027e5a4:
        lVar8 = (long)(int)uVar5;
        do {
          lVar8 = lVar8 + -1;
          if (iVar2 + 1 == (int)uVar5) {
            uVar5 = l & 0xffffffff;
            break;
          }
          iVar3 = (**this->_vptr_CVmQSortData)(this,lVar8,sVar4);
          uVar5 = (ulong)((int)uVar5 - 1);
        } while (0 < iVar3);
        sVar9 = (size_t)iVar10;
        iVar3 = (int)uVar5;
        sVar6 = (size_t)iVar3;
        (*this->_vptr_CVmQSortData[1])(this,sVar9,sVar6);
        iVar7 = (int)sVar4;
        if (iVar3 == iVar7) {
          sVar4 = sVar9;
        }
        if (iVar10 == iVar7) {
          sVar4 = sVar6;
        }
      } while (iVar10 < iVar3);
      (*this->_vptr_CVmQSortData[1])(this,sVar9,sVar6);
      (*this->_vptr_CVmQSortData[1])(this,sVar9,r);
      if (iVar2 <= (int)local_54) {
        sort(this,l,(long)(int)local_54);
      }
    } while ((iVar10 < iVar1) && (l = (size_t)(int)(local_54 + 2), l < r));
  }
  return;
}

Assistant:

void CVmQSortData::sort(VMG_ size_t l, size_t r)
{
    /* proceed if we have a non-empty range */
    if (r > l)
    {
        int i, j;
        size_t v_idx = r;

        /* start at the ends of the range */
		i = (int)l - 1;
        j = r;

        /* partition the range */
        do
        {
            /* find the leftmost element >= the right element */
            do
            {
                ++i;
			} while (i != (int)r && compare(vmg_ i, v_idx) < 0);

            /* find the rightmost element <= the right element */
            do
            {
                --j;
			} while (j != (int)l && compare(vmg_ j, v_idx) > 0);

            /* exchange elements i and j */
            exchange(vmg_ i, j);

            /* if we moved the 'v' element, follow that in the index */
			if ((int)v_idx == i)
                v_idx = j;
			else if ((int)v_idx == j)
                v_idx = i;

        } while (j > i);

        /* undo the last exchange */
        exchange(vmg_ i, j);

        /* exchange the right value into the pivot point */
        exchange(vmg_ i, r);

        /* recursively sort the subranges */
		if (i > (int)l)
            sort(vmg_ l, i - 1);
		if (i < (int)r)
            sort(vmg_ i + 1, r);
    }
}